

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  ostream *poVar1;
  GTestLog local_18;
  int local_14;
  Mutex *pMStack_10;
  int gtest_error;
  Mutex *this_local;
  
  pMStack_10 = this;
  local_14 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (local_14 != 0) {
    GTestLog::GTestLog(&local_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6ab);
    poVar1 = GTestLog::GetStream(&local_18);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_init(&mutex_, nullptr)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_14);
    GTestLog::~GTestLog(&local_18);
  }
  (this->super_MutexBase).has_owner_ = false;
  return;
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, nullptr));
    has_owner_ = false;
  }